

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O3

void GetFileExtension(ctmbstr path,tmbchar *ext,uint maxExt)

{
  char cVar1;
  uint uVar2;
  ctmbstr s2;
  
  uVar2 = prvTidytmbstrlen(path);
  *ext = '\0';
  s2 = path + (int)(uVar2 - 1);
  do {
    cVar1 = *s2;
    if (cVar1 == '\\') {
      return;
    }
    if (cVar1 == '/') {
      return;
    }
    if (cVar1 == '.') {
      prvTidytmbstrncpy(ext,s2,0x14);
      return;
    }
    uVar2 = uVar2 - 1;
    s2 = s2 + -1;
  } while (1 < (int)uVar2);
  return;
}

Assistant:

static void GetFileExtension( ctmbstr path, tmbchar *ext, uint maxExt )
{
    int i = TY_(tmbstrlen)(path) - 1;
    
    ext[0] = '\0';
    
    do {
        if ( path[i] == '/' || path[i] == '\\' )
            break;
        else if ( path[i] == '.' )
        {
            TY_(tmbstrncpy)( ext, path+i, maxExt );
            break;
        }
    } while ( --i > 0 );
}